

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseOutgoing.cpp
# Opt level: O2

Result __thiscall
tonk::SessionOutgoing::queueMessage
          (SessionOutgoing *this,uint queueIndex,MessageType messageType,uint8_t *data,size_t bytes)

{
  _func_int **pp_Var1;
  Result *success;
  undefined4 in_register_00000034;
  ulong in_R9;
  int iVar2;
  bool bVar3;
  Locker locker;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  if (in_R9 < 0x500) {
    locker.TheLock = (Lock *)(CONCAT44(in_register_00000034,queueIndex) + 0x238);
    std::recursive_mutex::lock((recursive_mutex *)locker.TheLock);
    iVar2 = 2;
    while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
      bVar3 = OutgoingQueue::Append
                        ((OutgoingQueue *)
                         (CONCAT44(in_register_00000034,queueIndex) + 0x318 +
                         (ulong)messageType * 0x28),(uint)data,(uint8_t *)bytes,(uint)in_R9);
      if (bVar3) {
        (this->super_IIncomingToOutgoing)._vptr_IIncomingToOutgoing = (_func_int **)0x0;
        goto LAB_00125934;
      }
      OutgoingQueue::PushAndGetFreshBuffer((OutgoingQueue *)this);
      if ((this->super_IIncomingToOutgoing)._vptr_IIncomingToOutgoing != (_func_int **)0x0)
      goto LAB_00125934;
      Result::~Result((Result *)this);
    }
    std::__cxx11::to_string(&local_50,in_R9);
    std::operator+(&local_70,&local_50," byte message caused Append failure");
    pp_Var1 = (_func_int **)operator_new(0x38);
    *pp_Var1 = (_func_int *)"SessionOutgoing::queueMessage";
    std::__cxx11::string::string((string *)(pp_Var1 + 1),(string *)&local_70);
    *(undefined4 *)(pp_Var1 + 5) = 0;
    pp_Var1[6] = (_func_int *)0x2;
    (this->super_IIncomingToOutgoing)._vptr_IIncomingToOutgoing = pp_Var1;
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
LAB_00125934:
    Locker::~Locker(&locker);
  }
  else {
    std::__cxx11::to_string(&local_50,in_R9);
    std::operator+(&local_70,&local_50," byte message too large");
    pp_Var1 = (_func_int **)operator_new(0x38);
    *pp_Var1 = (_func_int *)"SessionOutgoing::queueMessage";
    std::__cxx11::string::string((string *)(pp_Var1 + 1),(string *)&local_70);
    *(undefined4 *)(pp_Var1 + 5) = 0;
    pp_Var1[6] = (_func_int *)0x5;
    (this->super_IIncomingToOutgoing)._vptr_IIncomingToOutgoing = pp_Var1;
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return (Result)(ErrorResult *)this;
}

Assistant:

Result SessionOutgoing::queueMessage(
    unsigned queueIndex,
    protocol::MessageType messageType,
    const uint8_t* data,
    size_t bytes)
{
    // WARNING: This function is not called on the Connection green thread,
    // so accessing members here is not threadsafe by default.

    static_assert(TONK_MAX_UNORDERED_BYTES == TONK_MAX_UNRELIABLE_BYTES, "Update this");

    // This function only supports a few types of messages: Unreliable, Unordered, Control
    TONK_DEBUG_ASSERT(
        messageType < protocol::MessageType_StartOfReliables ||
        messageType >= protocol::MessageType_Control);

    // Message types must be in the proper queues
    TONK_DEBUG_ASSERT(
        (messageType < protocol::MessageType_StartOfReliables && queueIndex == Queue_Unreliable) ||
        (messageType == protocol::MessageType_Control && queueIndex == Queue_Unmetered) ||
        (messageType == protocol::MessageType_Unordered && queueIndex == Queue_Unmetered)
    );

    // Check for oversized messages without any additions up front to avoid
    // integer overflow issues
    if (bytes >= TONK_MAX_UNRELIABLE_BYTES)
    {
        return Result("SessionOutgoing::queueMessage",
            std::to_string(bytes) + " byte message too large",
            ErrorType::Tonk,
            Tonk_MessageTooLarge);
    }

    Locker locker(OutgoingQueueLock);

    TONK_DEBUG_ASSERT(TONK_MAX_UNRELIABLE_BYTES < MaxMessageSectionBytes);

    OutgoingQueue* queue = &Queues[queueIndex];

    // Try #1 : Append to existing buffer - Fails if too big or not created yet
    // Try #2 : Append to fresh buffer
    for (int tries = 0; tries < 2; ++tries)
    {
        // Attempt to append a message to the queue's workspace buffer
        if (queue->Append(messageType, data, static_cast<unsigned>(bytes))) {
            return Result::Success();
        }

        // Need more space- Push the workspace onto the queue and try again
        const Result result = queue->PushAndGetFreshBuffer();
        if (result.IsFail()) {
            return result;
        }
    }

    TONK_DEBUG_BREAK(); // Should never get here
    return Result("SessionOutgoing::queueMessage",
        std::to_string(bytes) + " byte message caused Append failure",
        ErrorType::Tonk,
        Tonk_Error);
}